

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

char * testing::internal::CodePointToUtf8(UInt32 code_point,char *str)

{
  byte bVar1;
  String local_20;
  
  if (code_point < 0x80) {
    str[1] = '\0';
  }
  else {
    bVar1 = (byte)code_point;
    if (code_point < 0x800) {
      str[2] = '\0';
      str[1] = bVar1 & 0x3f | 0x80;
      *str = (byte)(code_point >> 6) | 0xc0;
      return str;
    }
    if (code_point < 0x10000) {
      str[3] = '\0';
      str[2] = bVar1 & 0x3f | 0x80;
      str[1] = (byte)(code_point >> 6) & 0x3f | 0x80;
      code_point = (UInt32)(byte)((byte)(code_point >> 0xc) | 0xe0);
    }
    else {
      if (0x1fffff < code_point) {
        String::Format((char *)&local_20,"(Invalid Unicode 0x%X)");
        strncpy(str,local_20.c_str_,0x20);
        String::~String(&local_20);
        str[0x1f] = '\0';
        return str;
      }
      str[4] = '\0';
      str[3] = bVar1 & 0x3f | 0x80;
      str[2] = (byte)(code_point >> 6) & 0x3f | 0x80;
      str[1] = (byte)(code_point >> 0xc) & 0x3f | 0x80;
      code_point = (UInt32)(byte)((byte)(code_point >> 0x12) | 0xf0);
    }
  }
  *str = (char)code_point;
  return str;
}

Assistant:

char* CodePointToUtf8(UInt32 code_point, char* str) {
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else if (code_point <= kMaxCodePoint4) {
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  } else {
    // The longest string String::Format can produce when invoked
    // with these parameters is 28 character long (not including
    // the terminating nul character). We are asking for 32 character
    // buffer just in case. This is also enough for strncpy to
    // null-terminate the destination string.
    posix::StrNCpy(
        str, String::Format("(Invalid Unicode 0x%X)", code_point).c_str(), 32);
    str[31] = '\0';  // Makes sure no change in the format to strncpy leaves
                     // the result unterminated.
  }
  return str;
}